

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O2

void __thiscall FileReceiveSession::on_error(FileReceiveSession *this,Poll *p,int e)

{
  path pStack_48;
  
  if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__cxx11::string::string((string *)&pStack_48,(string *)&this->file);
    std::function<void_(boost::filesystem::path)>::operator()(&this->fail,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  Subscriber::on_error(&this->super_Subscriber,p,e);
  return;
}

Assistant:

void FileReceiveSession::on_error(Poll &p, int e) {
  if (this->fail)
    this->fail(file);
  Subscriber::on_error(p, e);
}